

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadZSegs(FileReaderBase *data)

{
  FileReaderBase *pFVar1;
  byte local_2b;
  ushort local_2a;
  uint local_28;
  BYTE side;
  uint uStack_24;
  WORD line;
  DWORD v2;
  DWORD v1;
  line_t *ldef;
  FileReaderBase *pFStack_10;
  int i;
  FileReaderBase *data_local;
  
  pFStack_10 = data;
  for (ldef._4_4_ = 0; ldef._4_4_ < numsegs; ldef._4_4_ = ldef._4_4_ + 1) {
    pFVar1 = FileReaderBase::operator>>(pFStack_10,&stack0xffffffffffffffdc);
    pFVar1 = FileReaderBase::operator>>(pFVar1,&local_28);
    pFVar1 = FileReaderBase::operator>>(pFVar1,&local_2a);
    FileReaderBase::operator>>(pFVar1,&local_2b);
    segs[ldef._4_4_].v1 = vertexes + uStack_24;
    segs[ldef._4_4_].v2 = vertexes + local_28;
    _v2 = lines + local_2a;
    segs[ldef._4_4_].linedef = _v2;
    segs[ldef._4_4_].sidedef = _v2->sidedef[local_2b];
    segs[ldef._4_4_].frontsector = _v2->sidedef[local_2b]->sector;
    if (((_v2->flags & 4) == 0) || (_v2->sidedef[(int)(local_2b ^ 1)] == (side_t *)0x0)) {
      segs[ldef._4_4_].backsector = (sector_t *)0x0;
      _v2->flags = _v2->flags & 0xfffffffb;
    }
    else {
      segs[ldef._4_4_].backsector = _v2->sidedef[(int)(local_2b ^ 1)]->sector;
    }
  }
  return;
}

Assistant:

void P_LoadZSegs (FileReaderBase &data)
{
	for (int i = 0; i < numsegs; ++i)
	{
		line_t *ldef;
		DWORD v1, v2;
		WORD line;
		BYTE side;

		data >> v1 >> v2 >> line >> side;

		segs[i].v1 = &vertexes[v1];
		segs[i].v2 = &vertexes[v2];
		segs[i].linedef = ldef = &lines[line];
		segs[i].sidedef = ldef->sidedef[side];
		segs[i].frontsector = ldef->sidedef[side]->sector;
		if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
		{
			segs[i].backsector = ldef->sidedef[side^1]->sector;
		}
		else
		{
			segs[i].backsector = 0;
			ldef->flags &= ~ML_TWOSIDED;
		}
	}
}